

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Image * GenImageGradientRadial
                  (Image *__return_storage_ptr__,int width,int height,float density,Color inner,
                  Color outer)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  pvVar2 = malloc((long)(height * width) << 2);
  if (0 < height) {
    iVar1 = height;
    if (width < height) {
      iVar1 = width;
    }
    lVar5 = (long)pvVar2 + 3;
    uVar3 = 0;
    do {
      if (0 < width) {
        uVar4 = 0;
        do {
          fVar6 = hypotf((float)(int)uVar4 - (float)width * 0.5,
                         (float)(int)uVar3 - (float)height * 0.5);
          fVar6 = (fVar6 - (float)iVar1 * 0.5 * density) / ((1.0 - density) * (float)iVar1 * 0.5);
          if (fVar6 <= 0.0) {
            fVar6 = 0.0;
          }
          if (1.0 <= fVar6) {
            fVar6 = 1.0;
          }
          fVar7 = 1.0 - fVar6;
          *(char *)(lVar5 + -3 + uVar4 * 4) =
               (char)(int)(fVar7 * (float)((uint)inner & 0xff) + (float)((uint)outer & 0xff) * fVar6
                          );
          *(char *)(lVar5 + -2 + uVar4 * 4) =
               (char)(int)(fVar7 * (float)((uint)inner >> 8 & 0xff) +
                          (float)((uint)outer >> 8 & 0xff) * fVar6);
          *(char *)(lVar5 + -1 + uVar4 * 4) =
               (char)(int)(fVar7 * (float)((uint)inner >> 0x10 & 0xff) +
                          (float)((uint)outer >> 0x10 & 0xff) * fVar6);
          *(char *)(lVar5 + uVar4 * 4) =
               (char)(int)(fVar7 * (float)((uint)inner >> 0x18) +
                          fVar6 * (float)((uint)outer >> 0x18));
          uVar4 = uVar4 + 1;
        } while ((uint)width != uVar4);
      }
      uVar3 = uVar3 + 1;
      lVar5 = lVar5 + (ulong)(uint)width * 4;
    } while (uVar3 != (uint)height);
  }
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientRadial(int width, int height, float density, Color inner, Color outer)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));
    float radius = (width < height)? (float)width/2.0f : (float)height/2.0f;

    float centerX = (float)width/2.0f;
    float centerY = (float)height/2.0f;

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            float dist = hypotf((float)x - centerX, (float)y - centerY);
            float factor = (dist - radius*density)/(radius*(1.0f - density));

            factor = (float)fmax(factor, 0.0f);
            factor = (float)fmin(factor, 1.f); // dist can be bigger than radius, so we have to check

            pixels[y*width + x].r = (int)((float)outer.r*factor + (float)inner.r*(1.0f - factor));
            pixels[y*width + x].g = (int)((float)outer.g*factor + (float)inner.g*(1.0f - factor));
            pixels[y*width + x].b = (int)((float)outer.b*factor + (float)inner.b*(1.0f - factor));
            pixels[y*width + x].a = (int)((float)outer.a*factor + (float)inner.a*(1.0f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}